

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scaler.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Scaler::InternalSwap(Scaler *this,Scaler *other)

{
  intptr_t iVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  LogMessage *pLVar7;
  LogFinisher local_89;
  LogMessage local_88;
  LogMessage local_50;
  
  iVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar1;
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    pLVar7 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar7);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar5 = (this->shiftvalue_).current_size_;
  iVar6 = (this->shiftvalue_).total_size_;
  pvVar2 = (this->shiftvalue_).arena_or_elements_;
  iVar4 = (other->shiftvalue_).total_size_;
  pvVar3 = (other->shiftvalue_).arena_or_elements_;
  (this->shiftvalue_).current_size_ = (other->shiftvalue_).current_size_;
  (this->shiftvalue_).total_size_ = iVar4;
  (this->shiftvalue_).arena_or_elements_ = pvVar3;
  (other->shiftvalue_).current_size_ = iVar5;
  (other->shiftvalue_).total_size_ = iVar6;
  (other->shiftvalue_).arena_or_elements_ = pvVar2;
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    pLVar7 = google::protobuf::internal::LogMessage::operator<<
                       (&local_88,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_89,pLVar7);
    google::protobuf::internal::LogMessage::~LogMessage(&local_88);
  }
  iVar5 = (this->scalevalue_).current_size_;
  iVar6 = (this->scalevalue_).total_size_;
  pvVar2 = (this->scalevalue_).arena_or_elements_;
  iVar4 = (other->scalevalue_).total_size_;
  pvVar3 = (other->scalevalue_).arena_or_elements_;
  (this->scalevalue_).current_size_ = (other->scalevalue_).current_size_;
  (this->scalevalue_).total_size_ = iVar4;
  (this->scalevalue_).arena_or_elements_ = pvVar3;
  (other->scalevalue_).current_size_ = iVar5;
  (other->scalevalue_).total_size_ = iVar6;
  (other->scalevalue_).arena_or_elements_ = pvVar2;
  return;
}

Assistant:

void Scaler::InternalSwap(Scaler* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  shiftvalue_.InternalSwap(&other->shiftvalue_);
  scalevalue_.InternalSwap(&other->scalevalue_);
}